

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsClient.cpp
# Opt level: O2

void __thiscall Scs::Client::Client(Client *this,ClientParams *params)

{
  Allocator<char> local_32;
  Allocator<char> local_31;
  
  (this->super_IClient)._vptr_IClient = (_func_int **)&PTR__Client_001888a8;
  memset(&this->m_socket,0,0x98);
  std::__cxx11::basic_string<char,std::char_traits<char>,Scs::Allocator<char>>::
  basic_string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,std::char_traits<char>,Scs::Allocator<char>> *)&this->m_port,
             &params->port,&local_31);
  std::__cxx11::basic_string<char,std::char_traits<char>,Scs::Allocator<char>>::
  basic_string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,std::char_traits<char>,Scs::Allocator<char>> *)&this->m_address,
             &params->address,&local_32);
  this->m_timeoutMs = (long)(params->timeoutSeconds * 1000.0);
  (this->m_status)._M_i = Initial;
  (this->m_error)._M_base._M_i = false;
  SendQueue::SendQueue(&this->m_sendQueue);
  return;
}

Assistant:

Client::Client(const ClientParams & params) :
	m_port(params.port),
	m_address(params.address),
	m_timeoutMs(static_cast<long long>(params.timeoutSeconds * 1000.0))
{
}